

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O3

void __thiscall SchemaAdapter::~SchemaAdapter(SchemaAdapter *this)

{
  ~SchemaAdapter(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~SchemaAdapter() {
        }